

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O0

void subtract_block_16xn_avx2
               (int rows,int16_t *diff_ptr,ptrdiff_t diff_stride,uint8_t *src_ptr,
               ptrdiff_t src_stride,uint8_t *pred_ptr,ptrdiff_t pred_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [16];
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  long in_R8;
  undefined1 (*in_R9) [16];
  long in_stack_00000008;
  __m256i p_0;
  __m256i s_0;
  __m128i p;
  __m128i s;
  int32_t j;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  int local_104;
  undefined1 (*local_100) [16];
  undefined1 (*local_f0) [16];
  undefined8 *local_e0;
  
  local_100 = in_R9;
  local_f0 = in_RCX;
  local_e0 = in_RSI;
  for (local_104 = 0; local_104 < in_EDI; local_104 = local_104 + 1) {
    auVar1 = vlddqu_avx(*local_f0);
    auVar2 = vlddqu_avx(*local_100);
    auVar3 = vpmovzxbw_avx2(auVar1);
    auVar4 = vpmovzxbw_avx2(auVar2);
    auVar3 = vpsubw_avx2(auVar3,auVar4);
    local_1a0 = auVar3._0_8_;
    uStack_198 = auVar3._8_8_;
    uStack_190 = auVar3._16_8_;
    uStack_188 = auVar3._24_8_;
    *local_e0 = local_1a0;
    local_e0[1] = uStack_198;
    local_e0[2] = uStack_190;
    local_e0[3] = uStack_188;
    local_f0 = (undefined1 (*) [16])(*local_f0 + in_R8);
    local_100 = (undefined1 (*) [16])(*local_100 + in_stack_00000008);
    local_e0 = (undefined8 *)(in_RDX * 2 + (long)local_e0);
  }
  return;
}

Assistant:

static inline void subtract_block_16xn_avx2(
    int rows, int16_t *diff_ptr, ptrdiff_t diff_stride, const uint8_t *src_ptr,
    ptrdiff_t src_stride, const uint8_t *pred_ptr, ptrdiff_t pred_stride) {
  for (int32_t j = 0; j < rows; ++j) {
    __m128i s = _mm_lddqu_si128((__m128i *)(src_ptr));
    __m128i p = _mm_lddqu_si128((__m128i *)(pred_ptr));
    __m256i s_0 = _mm256_cvtepu8_epi16(s);
    __m256i p_0 = _mm256_cvtepu8_epi16(p);
    const __m256i d_0 = _mm256_sub_epi16(s_0, p_0);
    _mm256_store_si256((__m256i *)(diff_ptr), d_0);
    src_ptr += src_stride;
    pred_ptr += pred_stride;
    diff_ptr += diff_stride;
  }
}